

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O0

bool __thiscall OB::Color::valid_hstr(Color *this,string *str)

{
  bool bVar1;
  const_reference this_00;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_238 [32];
  stringstream local_218 [8];
  stringstream ss;
  ostream local_208 [376];
  undefined1 local_90 [8];
  string hstr;
  undefined1 local_60 [8];
  regex rx;
  smatch m;
  string *str_local;
  Color *this_local;
  
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&rx._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,
             "^#?((?:[0-9a-fA-F]{3}){1,2})$",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (str,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&rx._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,0x20);
  if (bVar1) {
    this_00 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&rx._M_automaton.
                               super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,1);
    std::__cxx11::sub_match::operator_cast_to_string((string_type *)local_90,(sub_match *)this_00);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 3) {
      std::__cxx11::stringstream::stringstream(local_218);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      poVar4 = std::operator<<(local_208,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      poVar4 = std::operator<<(poVar4,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      poVar4 = std::operator<<(poVar4,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      poVar4 = std::operator<<(poVar4,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      poVar4 = std::operator<<(poVar4,*pcVar3);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
      std::operator<<(poVar4,*pcVar3);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)local_90,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::stringstream::~stringstream(local_218);
    }
    std::__cxx11::string::operator=((string *)str,(string *)local_90);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&rx._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return this_local._7_1_;
}

Assistant:

bool valid_hstr(std::string& str) const
  {
    std::smatch m;
    std::regex rx {"^#?((?:[0-9a-fA-F]{3}){1,2})$"};

    if (std::regex_match(str, m, rx, std::regex_constants::match_not_null))
    {
      std::string hstr {m[1]};

      if (hstr.size() == 3)
      {
        std::stringstream ss;
        ss << hstr[0] << hstr[0] << hstr[1] << hstr[1] << hstr[2] << hstr[2];
        hstr = ss.str();
      }

      str = hstr;

      return true;
    }

    return false;
  }